

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O0

double anon_unknown.dwarf_496d6::getLengthFromCountour
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *contourX,
                 vector<unsigned_int,_std::allocator<unsigned_int>_> *contourY,
                 PointBase2D<unsigned_int> *startPoint,PointBase2D<unsigned_int> *endPoint)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  reference puVar6;
  uint *in_RCX;
  uint *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  int32_t distance;
  const_iterator yy;
  const_iterator xx;
  int32_t maximumDistance;
  const_iterator end;
  const_iterator y;
  const_iterator x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_60;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_58;
  uint *local_50;
  int local_44;
  uint *local_40;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_38;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30;
  uint *local_28;
  uint *local_20;
  double local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RDI);
  if (sVar5 < 2) {
    local_8 = 0.0;
  }
  else {
    local_30._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin
                           (in_stack_ffffffffffffff78);
    local_38._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cbegin
                           (in_stack_ffffffffffffff78);
    local_40 = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::cend
                                 (in_stack_ffffffffffffff78);
    local_44 = 0;
    while( true ) {
      local_50 = (uint *)__gnu_cxx::
                         __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                         ::operator-((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                      *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88
                                                ),
                                     CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          *)in_stack_ffffffffffffff78);
      if (!bVar2) break;
      local_58 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator+((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      local_60 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator+((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)in_stack_ffffffffffffff78);
        if (!bVar2) break;
        puVar6 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_30);
        in_stack_ffffffffffffff80 = *puVar6;
        puVar6 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_58);
        in_stack_ffffffffffffff88 = in_stack_ffffffffffffff80 - *puVar6;
        puVar6 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_30);
        in_stack_ffffffffffffff84 = *puVar6;
        puVar6 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_58);
        iVar3 = in_stack_ffffffffffffff88 * (in_stack_ffffffffffffff84 - *puVar6);
        puVar6 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_38);
        in_stack_ffffffffffffff8c = *puVar6;
        puVar6 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_60);
        iVar4 = in_stack_ffffffffffffff8c - *puVar6;
        puVar6 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_38);
        uVar1 = *puVar6;
        puVar6 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_60);
        iVar3 = iVar3 + iVar4 * (uVar1 - *puVar6);
        if (local_44 < iVar3) {
          local_44 = iVar3;
          puVar6 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&local_30);
          *local_20 = *puVar6;
          puVar6 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&local_38);
          local_20[1] = *puVar6;
          puVar6 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&local_58);
          *local_28 = *puVar6;
          puVar6 = __gnu_cxx::
                   __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*(&local_58);
          local_28[1] = *puVar6;
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_58);
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&local_60);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&local_30);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&local_38);
    }
    local_8 = sqrt((double)local_44);
  }
  return local_8;
}

Assistant:

double getLengthFromCountour( const std::vector < uint32_t > & contourX, const std::vector < uint32_t > & contourY, PointBase2D< uint32_t > & startPoint,
                                 PointBase2D< uint32_t > & endPoint )
    {
        if ( contourX.size() > 1 ) {
            std::vector < uint32_t >::const_iterator x   = contourX.cbegin();
            std::vector < uint32_t >::const_iterator y   = contourY.cbegin();
            std::vector < uint32_t >::const_iterator end = contourX.cend();

            int32_t maximumDistance = 0;

            for ( ; x != (end - 1); ++x, ++y ) {
                std::vector < uint32_t >::const_iterator xx = x + 1;
                std::vector < uint32_t >::const_iterator yy = y + 1;

                for ( ; xx != end; ++xx, ++yy ) {
                    const int32_t distance = static_cast<int32_t>(*x - *xx) * static_cast<int32_t>(*x - *xx) +
                                             static_cast<int32_t>(*y - *yy) * static_cast<int32_t>(*y - *yy);

                    if ( maximumDistance < distance ) {
                        maximumDistance = distance;

                        startPoint.x = *x;
                        startPoint.y = *y;

                        endPoint.x = *xx;
                        endPoint.y = *xx;
                    }
                }
            }
            return sqrt( static_cast<double>(maximumDistance) );
        }
        else {
            return 0;
        }
    }